

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void int_trp_assert_error(char *exp,char *file,int line)

{
  long local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  trun::TestRunner::GetCurrentTestModule();
  trun::TestResponseProxy::AssertError((TestResponseProxy *)(local_30 + 0xa0),exp,file,line);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

static void int_trp_assert_error(const char *exp, const char *file, int line) {
    TestRunner::GetCurrentTestModule()->GetTestResponseProxy().AssertError(exp, file, line);
}